

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientSession.cpp
# Opt level: O3

void __thiscall
ki::protocol::net::ClientSession::on_control_message(ClientSession *this,PacketHeader *header)

{
  uint8_t uVar1;
  
  uVar1 = PacketHeader::get_opcode(header);
  if (uVar1 == '\x04') {
    on_keep_alive_response(this);
    return;
  }
  if (uVar1 != '\x03') {
    if (uVar1 == '\0') {
      on_session_offer(this);
      return;
    }
    (**(code **)(*(long *)((long)&this->_vptr_ClientSession + (long)this->_vptr_ClientSession[-3]) +
                0x38))((_func_int *)
                       ((long)&this->_vptr_ClientSession + (long)this->_vptr_ClientSession[-3]),4);
    return;
  }
  on_keep_alive(this);
  return;
}

Assistant:

void ClientSession::on_control_message(const PacketHeader& header)
	{
		switch ((control::Opcode)header.get_opcode())
		{
		case control::Opcode::SESSION_OFFER:
			on_session_offer();
			break;

		case control::Opcode::KEEP_ALIVE:
			on_keep_alive();
			break;

		case control::Opcode::KEEP_ALIVE_RSP:
			on_keep_alive_response();
			break;

		default:
			close(SessionCloseErrorCode::UNHANDLED_CONTROL_MESSAGE);
			break;
		}
	}